

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

Var __thiscall
Js::LocalObjectAddressForRegSlot::GetValue(LocalObjectAddressForRegSlot *this,BOOL fUpdated)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  BOOL fUpdated_local;
  LocalObjectAddressForRegSlot *this_local;
  
  if ((fUpdated == 0) ||
     (iVar3 = (*(this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress[3])(), iVar3 != 0)) {
    iVar3 = (*(this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress[3])();
    if ((iVar3 != 0) && (bVar2 = VarIs<Js::JavascriptString>(this->value), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x6a4,"(VarIs<JavascriptString>(value))",
                                  "VarIs<JavascriptString>(value)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local = (LocalObjectAddressForRegSlot *)this->value;
  }
  else {
    if (this->pFrame == (DiagStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x6ab,"(pFrame)","pFrame");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[5])(this->pFrame,(ulong)this->regSlot,0);
    this_local = (LocalObjectAddressForRegSlot *)CONCAT44(extraout_var,iVar3);
  }
  return this_local;
}

Assistant:

Var LocalObjectAddressForRegSlot::GetValue(BOOL fUpdated)
    {
        if (!fUpdated || IsInDeadZone())
        {
#if DBG
            if (IsInDeadZone())
            {
                // If we're in a dead zone, the value will be the
                // [Uninitialized block variable] string.
                Assert(VarIs<JavascriptString>(value));
            }
#endif // DBG

            return value;
        }

        Assert(pFrame);
        return pFrame->GetRegValue(regSlot);
    }